

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVectorImpl<std::pair<llvm::StringRef,llvm::StringRef>>::
emplace_back<std::pair<llvm::StringRef,llvm::StringRef>>
          (SmallVectorImpl<std::pair<llvm::StringRef,llvm::StringRef>> *this,
          pair<llvm::StringRef,_llvm::StringRef> *Args)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  undefined8 *puVar4;
  pair<llvm::StringRef,_llvm::StringRef> *Args_local;
  SmallVectorImpl<std::pair<llvm::StringRef,_llvm::StringRef>_> *this_local;
  
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  sVar3 = SmallVectorBase::capacity((SmallVectorBase *)this);
  if (sVar3 <= sVar2) {
    SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true>::grow
              ((SmallVectorTemplateBase<std::pair<llvm::StringRef,_llvm::StringRef>,_true> *)this,0)
    ;
  }
  lVar1 = *(long *)this;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  puVar4 = (undefined8 *)(lVar1 + sVar2 * 0x20);
  *puVar4 = (Args->first).Data;
  puVar4[1] = (Args->first).Length;
  puVar4[2] = (Args->second).Data;
  puVar4[3] = (Args->second).Length;
  sVar2 = SmallVectorBase::size((SmallVectorBase *)this);
  SmallVectorBase::set_size((SmallVectorBase *)this,sVar2 + 1);
  return;
}

Assistant:

void emplace_back(ArgTypes &&... Args) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void *)this->end()) T(std::forward<ArgTypes>(Args)...);
    this->set_size(this->size() + 1);
  }